

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O3

void __thiscall
QOpenGLTextureHelper::qt_TextureParameterf
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLenum pname
          ,GLfloat param)

{
  QOpenGLFunctions *pQVar1;
  GLenum GVar2;
  GLenum GVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->functions;
  bVar4 = 5 < target - 0x8515;
  GVar2 = 0x8513;
  if (bVar4) {
    GVar2 = target;
  }
  GVar3 = 0x8514;
  if (bVar4) {
    GVar3 = bindingTarget;
  }
  local_38 = CONCAT44(0xaaaaaaaa,GVar2);
  (**(code **)(*(long *)pQVar1 + 200))(GVar3,(long)&local_38 + 4);
  (*(code *)**(undefined8 **)pQVar1)(local_38 & 0xffffffff,texture);
  (**(code **)(*(long *)this->functions + 0x148))(param,target,pname);
  (*(code *)**(undefined8 **)pQVar1)(local_38 & 0xffffffff,local_38._4_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureParameterf(GLuint texture, GLenum target, GLenum bindingTarget, GLenum pname, GLfloat param)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    functions->glTexParameterf(target, pname, param);
}